

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O0

S1Angle S2::GetLength(S2Shape *shape)

{
  int iVar1;
  size_type extraout_RDX;
  S2PointSpan polyline;
  S2 *local_60;
  pointer local_58;
  double local_50;
  int local_48;
  int chain_id;
  int local_34;
  undefined1 local_30 [4];
  int num_chains;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Shape *shape_local;
  S1Angle length;
  
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)shape;
  iVar1 = (*shape->_vptr_S2Shape[4])();
  if (iVar1 == 1) {
    S1Angle::S1Angle((S1Angle *)&shape_local);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
    local_34 = (**(code **)((long)(vertices.
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->c_[0] + 0x30
                           ))();
    for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
      GetChainVertices((S2Shape *)
                       vertices.
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,local_48,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
      absl::Span<Vector3<double>const>::
      Span<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,void,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((Span<Vector3<double>const> *)&local_60,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
      polyline.len_ = extraout_RDX;
      polyline.ptr_ = local_58;
      local_50 = (double)GetLength(local_60,polyline);
      S1Angle::operator+=((S1Angle *)&shape_local,(S1Angle)local_50);
    }
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_30);
  }
  else {
    shape_local = (S2Shape *)S1Angle::Zero();
  }
  return (S1Angle)(double)shape_local;
}

Assistant:

S1Angle GetLength(const S2Shape& shape) {
  if (shape.dimension() != 1) return S1Angle::Zero();
  S1Angle length;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    length += S2::GetLength(vertices);
  }
  return length;
}